

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Command_Book.cpp
# Opt level: O0

void __thiscall bookClass::buy(bookClass *this,string *ISBN,int num)

{
  _Ios_Openmode _Var1;
  size_type sVar2;
  int in_EDX;
  string *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  fstream file;
  char in_stack_0000003f;
  string *in_stack_00000040;
  unrolledLinkedListClass *in_stack_00000048;
  vector<int,_std::allocator<int>_> index;
  char *__off;
  undefined4 in_stack_fffffffffffffd60;
  undefined8 local_280;
  undefined8 local_278;
  char local_270 [16];
  char local_260 [504];
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  double in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffbf;
  dataClass *in_stack_ffffffffffffffc0;
  vector<int,_std::allocator<int>_> local_30;
  int local_14;
  
  local_14 = in_EDX;
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb0,in_RSI);
  unrolledLinkedListClass::readIndexData(in_stack_00000048,in_stack_00000040,in_stack_0000003f);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_30);
  if (sVar2 == 1) {
    std::vector<int,_std::allocator<int>_>::operator[](&local_30,0);
    read_file((bookClass *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
              in_stack_ffffffffffffff9c);
    if (*(int *)&in_RDI[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage < local_14) {
      success = '0';
      puts("Invalid");
    }
    else {
      *(int *)&in_RDI[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage =
           *(int *)&in_RDI[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage - local_14;
      std::vector<int,_std::allocator<int>_>::operator[](&local_30,0);
      dataClass::changeBookData
                ((dataClass *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
      income = income + (double)local_14 *
                        (double)in_RDI[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish;
      printf("%.2lf\n",
             (double)local_14 *
             (double)in_RDI[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish);
      std::fstream::fstream(local_270);
      _Var1 = std::operator|(_S_in,_S_out);
      _Var1 = std::operator|(_Var1,_S_bin);
      std::fstream::open(local_270,0x11c0a5);
      __off = local_260;
      std::fpos<__mbstate_t>::fpos
                ((fpos<__mbstate_t> *)CONCAT44(_Var1,in_stack_fffffffffffffd60),(streamoff)__off);
      std::ostream::seekp(__off,local_280,local_278);
      std::ostream::write(local_260,0x1243f0);
      std::fstream::close();
      dataClass::recordFinance
                (in_stack_ffffffffffffffc0,(bool)in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb0
                );
      std::fstream::~fstream(local_270);
    }
  }
  else {
    success = '0';
    puts("Invalid");
  }
  std::vector<int,_std::allocator<int>_>::~vector(in_RDI);
  return;
}

Assistant:

void bookClass::buy(string ISBN, int num) {
	vector<int> index = Isbn.readIndexData(ISBN, '1');
	if (index.size() != 1) {ERROR; return ;}
	this->read_file(index[0]);
	if (this->num >= num) {
		this->num -= num;
		data_manager.changeBookData(this->num, index[0]);
		income += num * price;
		printf("%.2lf\n", num * price);
		fstream file;
		file.open("Data_Basic.dat", ios::in | ios::out | ios::binary);
		file.seekp(16);
		file.write(reinterpret_cast<char *> (&income), 8);
		file.close();
		data_manager.recordFinance(0, num * price);
	} else ERROR;
}